

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ImTextureID pvVar5;
  ImDrawCmd *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  ImDrawCmd *pIVar12;
  int iVar13;
  int iVar14;
  undefined1 in_ZMM1 [64];
  
  pIVar6 = (this->CmdBuffer).Data;
  iVar14 = (this->CmdBuffer).Size;
  pIVar12 = pIVar6 + (long)iVar14 + -1;
  if ((pIVar6[(long)iVar14 + -1].ElemCount != 0) &&
     (pIVar12->ClipRect != (this->_CmdHeader).ClipRect)) {
    IVar1 = (this->_CmdHeader).ClipRect;
    auVar7 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x20);
    auVar7 = vcmpps_avx((undefined1  [16])IVar1,auVar7,2);
    auVar8 = vshufps_avx(auVar7,auVar7,0x50);
    auVar7 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    if (((auVar7 & ~auVar8) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar7 & ~auVar8,0xf)) {
      pvVar5 = (this->_CmdHeader).TextureId;
      uVar2 = (this->_CmdHeader).VtxOffset;
      uVar3 = (this->IdxBuffer).Size;
      iVar14 = (this->CmdBuffer).Size;
      iVar4 = (this->CmdBuffer).Capacity;
      if (iVar14 == iVar4) {
        iVar14 = iVar14 + 1;
        if (iVar4 == 0) {
          iVar13 = 8;
        }
        else {
          iVar13 = iVar4 / 2 + iVar4;
        }
        if (iVar14 < iVar13) {
          iVar14 = iVar13;
        }
        if (iVar4 < iVar14) {
          pIVar12 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar14 * 0x38);
          pIVar6 = (this->CmdBuffer).Data;
          if (pIVar6 != (ImDrawCmd *)0x0) {
            memcpy(pIVar12,pIVar6,(long)(this->CmdBuffer).Size * 0x38);
            ImGui::MemFree((this->CmdBuffer).Data);
          }
          (this->CmdBuffer).Data = pIVar12;
          (this->CmdBuffer).Capacity = iVar14;
        }
      }
      pIVar6 = (this->CmdBuffer).Data;
      iVar14 = (this->CmdBuffer).Size;
      pIVar6[iVar14].ClipRect = IVar1;
      pIVar6[iVar14].TextureId = pvVar5;
      pIVar6[iVar14].VtxOffset = uVar2;
      pIVar6[iVar14].IdxOffset = uVar3;
      *(undefined8 *)&pIVar6[iVar14].ElemCount = 0;
      *(ImDrawCallback *)(&pIVar6[iVar14].ElemCount + 2) = (ImDrawCallback)0x0;
      pIVar6[iVar14].UserCallbackData = (void *)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar6[(long)iVar14 + -1].UserCallback != (ImDrawCallback)0x0) {
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1ef,"void ImDrawList::_OnChangedClipRect()");
  }
  if ((((1 < iVar14) && (pIVar6[(long)iVar14 + -1].ElemCount == 0)) &&
      (auVar7 = vpor_avx((undefined1  [16])(this->_CmdHeader).ClipRect ^
                         (undefined1  [16])pIVar6[(long)iVar14 + -2].ClipRect,
                         *(undefined1 (*) [16])&(this->_CmdHeader).ClipRect.w ^
                         *(undefined1 (*) [16])&pIVar6[(long)iVar14 + -2].ClipRect.w),
      auVar7 == (undefined1  [16])0x0)) &&
     (pIVar6[(long)iVar14 + -2].UserCallback == (ImDrawCallback)0x0)) {
    (this->CmdBuffer).Size = iVar14 + -1;
    return;
  }
  fVar9 = (this->_CmdHeader).ClipRect.y;
  fVar10 = (this->_CmdHeader).ClipRect.z;
  fVar11 = (this->_CmdHeader).ClipRect.w;
  (pIVar12->ClipRect).x = (this->_CmdHeader).ClipRect.x;
  (pIVar12->ClipRect).y = fVar9;
  pIVar6[(long)iVar14 + -1].ClipRect.z = fVar10;
  pIVar6[(long)iVar14 + -1].ClipRect.w = fVar11;
  return;
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}